

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_object_history.cpp
# Opt level: O0

bool __thiscall ON_HistoryRecord::GetDoubleValue(ON_HistoryRecord *this,int value_id,double *number)

{
  int iVar1;
  ON_Value *pOVar2;
  double *pdVar3;
  ON_DoubleValue *v;
  bool rc;
  double *number_local;
  int value_id_local;
  ON_HistoryRecord *this_local;
  
  v._7_1_ = false;
  pOVar2 = FindValueHelper(this,value_id,3,false);
  if (pOVar2 != (ON_Value *)0x0) {
    iVar1 = ON_SimpleArray<double>::Count((ON_SimpleArray<double> *)(pOVar2 + 1));
    if (iVar1 == 1) {
      pdVar3 = ON_SimpleArray<double>::operator[]((ON_SimpleArray<double> *)(pOVar2 + 1),0);
      *number = *pdVar3;
      v._7_1_ = true;
    }
  }
  return v._7_1_;
}

Assistant:

bool ON_HistoryRecord::GetDoubleValue( int value_id, double* number ) const
{
  bool rc = false;
  const ON_DoubleValue* v = static_cast<ON_DoubleValue*>(FindValueHelper(value_id,ON_Value::double_value,0));
  if ( v && 1 == v->m_value.Count())
  {
    *number = v->m_value[0];
    rc = true;
  }
  return rc;
}